

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O0

DDAMajorantIterator * __thiscall
pbrt::GridMedium::SampleRay(GridMedium *this,Ray *ray,Float raytMax,SampledWavelengths *lambda)

{
  Vector3f d;
  Point3f o;
  bool bVar1;
  SampledWavelengths *in_RDX;
  DenselySampledSpectrum *in_RSI;
  DDAMajorantIterator *in_RDI;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  SampledSpectrum SVar10;
  MajorantGrid *in_stack_00000028;
  Float in_stack_00000030;
  Float in_stack_00000034;
  Ray *in_stack_00000038;
  DDAMajorantIterator *in_stack_00000040;
  undefined1 in_stack_00000048 [16];
  SampledSpectrum sigma_t;
  SampledSpectrum sigma_s;
  SampledSpectrum sigma_a;
  Float *in_stack_000000b8;
  Ray *in_stack_000000c0;
  Transform *in_stack_000000c8;
  Float tMax;
  Float tMin;
  DDAMajorantIterator *this_00;
  DenselySampledSpectrum *this_01;
  Float *in_stack_ffffffffffffff08;
  Float *in_stack_ffffffffffffff10;
  Float in_stack_ffffffffffffff1c;
  Bounds3<float> *in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff3c;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff60;
  undefined1 auVar5 [56];
  undefined1 auVar9 [56];
  
  this_00 = in_RDI;
  this_01 = in_RSI;
  Transform::ApplyInverse(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
  Ray::operator=((Ray *)this_00,(Ray *)in_RDI);
  auVar5 = (undefined1  [56])0x0;
  auVar9 = (undefined1  [56])0x0;
  o.super_Tuple3<pbrt::Point3,_float>.z = in_stack_ffffffffffffff60;
  o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_ffffffffffffff58;
  o.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  d.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_ffffffffffffff40;
  d.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  d.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_ffffffffffffff3c;
  bVar1 = Bounds3<float>::IntersectP
                    (in_stack_ffffffffffffff20,o,d,in_stack_ffffffffffffff1c,
                     in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (bVar1) {
    SVar10 = DenselySampledSpectrum::Sample(this_01,in_RDX);
    auVar6._0_8_ = SVar10.values.values._8_8_;
    auVar6._8_56_ = auVar9;
    auVar2._0_8_ = SVar10.values.values._0_8_;
    auVar2._8_56_ = auVar5;
    vmovlpd_avx(auVar2._0_16_);
    vmovlpd_avx(auVar6._0_16_);
    SVar10 = DenselySampledSpectrum::Sample(this_01,in_RDX);
    auVar7._0_8_ = SVar10.values.values._8_8_;
    auVar7._8_56_ = auVar9;
    auVar3._0_8_ = SVar10.values.values._0_8_;
    auVar3._8_56_ = auVar5;
    vmovlpd_avx(auVar3._0_16_);
    vmovlpd_avx(auVar7._0_16_);
    SVar10 = SampledSpectrum::operator+((SampledSpectrum *)in_RSI,&this_00->sigma_t);
    auVar8._0_8_ = SVar10.values.values._8_8_;
    auVar8._8_56_ = auVar9;
    auVar4._0_8_ = SVar10.values.values._0_8_;
    auVar4._8_56_ = auVar5;
    vmovlpd_avx(auVar4._0_16_);
    vmovlpd_avx(auVar8._0_16_);
    Ray::Ray((Ray *)this_00,(Ray *)in_RDI);
    DDAMajorantIterator::DDAMajorantIterator
              (in_stack_00000040,in_stack_00000038,in_stack_00000034,in_stack_00000030,
               in_stack_00000028,(SampledSpectrum)in_stack_00000048);
  }
  else {
    memset(in_RDI,0,0x60);
    DDAMajorantIterator::DDAMajorantIterator(this_00);
  }
  return this_00;
}

Assistant:

SampleRay(Ray ray, Float raytMax,
                                  const SampledWavelengths &lambda) const {
        // Transform ray to medium's space and compute bounds overlap
        ray = renderFromMedium.ApplyInverse(ray, &raytMax);
        Float tMin, tMax;
        if (!bounds.IntersectP(ray.o, ray.d, raytMax, &tMin, &tMax))
            return {};
        DCHECK_LE(tMax, raytMax);

        // Sample spectra for grid medium $\sigmaa$ and $\sigmas$
        SampledSpectrum sigma_a = sigma_a_spec.Sample(lambda);
        SampledSpectrum sigma_s = sigma_s_spec.Sample(lambda);

        SampledSpectrum sigma_t = sigma_a + sigma_s;
        return DDAMajorantIterator(ray, tMin, tMax, &majorantGrid, sigma_t);
    }